

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<char_*,_char>_>,_char,_fmt::v5::basic_format_context<char_*,_char>_>
::on_replacement_field
          (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<char_*,_char>_>,_char,_fmt::v5::basic_format_context<char_*,_char>_>
           *this,char *p)

{
  type tVar1;
  type it;
  long in_RDI;
  basic_format_arg<fmt::v5::basic_format_context<char_*,_char>_> *in_stack_00000010;
  arg_formatter<fmt::v5::output_range<char_*,_char>_> *in_stack_00000018;
  custom_formatter<char,_fmt::v5::basic_format_context<char_*,_char>_> f;
  iterator in_stack_ffffffffffffffc8;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *in_stack_ffffffffffffffd0;
  context_type *in_stack_ffffffffffffffd8;
  arg_formatter<fmt::v5::output_range<char_*,_char>_> *in_stack_ffffffffffffffe0;
  custom_formatter<char,_fmt::v5::basic_format_context<char_*,_char>_> local_18 [3];
  
  internal::context_base<char_*,_fmt::v5::basic_format_context<char_*,_char>,_char>::parse_context
            ((context_base<char_*,_fmt::v5::basic_format_context<char_*,_char>,_char> *)(in_RDI + 8)
            );
  basic_parse_context<char,_fmt::v5::internal::error_handler>::advance_to
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  internal::custom_formatter<char,_fmt::v5::basic_format_context<char_*,_char>_>::custom_formatter
            (local_18,(basic_format_context<char_*,_char> *)(in_RDI + 8));
  tVar1 = visit_format_arg<fmt::v5::internal::custom_formatter<char,fmt::v5::basic_format_context<char*,char>>&,fmt::v5::basic_format_context<char*,char>>
                    ((custom_formatter<char,_fmt::v5::basic_format_context<char_*,_char>_> *)
                     in_stack_00000018,in_stack_00000010);
  if (!tVar1) {
    arg_formatter<fmt::v5::output_range<char_*,_char>_>::arg_formatter
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
               (format_specs *)in_stack_ffffffffffffffd0);
    it = visit_format_arg<fmt::v5::arg_formatter<fmt::v5::output_range<char*,char>>,fmt::v5::basic_format_context<char*,char>>
                   (in_stack_00000018,in_stack_00000010);
    internal::context_base<char_*,_fmt::v5::basic_format_context<char_*,_char>,_char>::advance_to
              ((context_base<char_*,_fmt::v5::basic_format_context<char_*,_char>,_char> *)
               (in_RDI + 8),it);
  }
  return;
}

Assistant:

void on_replacement_field(const Char *p) {
    context.parse_context().advance_to(p);
    internal::custom_formatter<Char, Context> f(context);
    if (!visit_format_arg(f, arg))
      context.advance_to(visit_format_arg(ArgFormatter(context), arg));
  }